

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::evaluateConstraint
          (LinearConstraint *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraint)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  element_type *peVar4;
  char *pcVar5;
  double dVar6;
  Index size_2;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  ostream *poVar11;
  string *psVar12;
  PointerType pdVar13;
  ulong uVar14;
  ulong uVar15;
  LinearConstraintImplementation *pLVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  Index size_1;
  Index size;
  double dVar20;
  bool isValid;
  ostringstream errorMsg;
  char local_222;
  scalar_sum_op<double,_double> local_221;
  PointerType local_220;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_218;
  Scalar local_208;
  VectorDynSize *local_200;
  undefined1 local_1f8 [16];
  long local_1e8;
  variable_if_dynamic<long,__1> local_1e0;
  VectorDynSize *local_1d8;
  variable_if_dynamic<long,__1> local_1c8;
  VectorDynSize *local_1c0;
  PointerType local_1b8;
  VectorDynSize *local_1b0;
  undefined1 local_1a8 [16];
  variable_if_dynamic<long,__1> local_198;
  PointerType local_190;
  variable_if_dynamic<long,__1> local_188;
  variable_if_dynamic<long,__1> local_180;
  variable_if_dynamic<long,__1> local_170;
  variable_if_dynamic<long,__1> vStack_168;
  long local_160;
  VectorDynSize *local_158;
  variable_if_dynamic<long,__1> local_150;
  VectorDynSize *local_140;
  variable_if_dynamic<long,__1> local_138;
  variable_if_dynamic<long,__1> local_128;
  PointerType local_118;
  
  pLVar16 = this->m_pimpl;
  local_1b0 = constraint;
  if (pLVar16->constrainsState == true) {
    local_222 = '\0';
    peVar4 = (pLVar16->stateConstraintMatrix).
             super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_220 = (PointerType)time;
    local_200 = control;
    (*peVar4->_vptr_TimeVaryingObject[2])(peVar4,&local_222);
    if (local_222 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unable to retrieve a valid state constraint matrix at time: "
                 ,0x3c);
      poVar11 = std::ostream::_M_insert<double>((double)local_220);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
      psVar12 = Constraint::name_abi_cxx11_(&this->super_Constraint);
      pcVar5 = (psVar12->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar5,"evaluateConstraint",(char *)local_1f8._0_8_);
      goto LAB_0016f0e2;
    }
    lVar7 = iDynTree::MatrixDynSize::cols();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 == lVar8) {
      sVar9 = iDynTree::MatrixDynSize::rows();
      sVar10 = Constraint::constraintSize(&this->super_Constraint);
      if (sVar9 != sVar10) goto LAB_0016ea47;
    }
    else {
LAB_0016ea47:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The state constraint matrix at time: ",0x25);
      poVar11 = std::ostream::_M_insert<double>((double)local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,
                 " has dimensions not matching with the specified state space dimension or constraint dimension."
                 ,0x5e);
      psVar12 = Constraint::name_abi_cxx11_(&this->super_Constraint);
      pcVar5 = (psVar12->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar5,"evaluateConstraint",(char *)local_1f8._0_8_);
      if ((VectorDynSize *)local_1f8._0_8_ != (VectorDynSize *)&local_1e8) {
        operator_delete((void *)local_1f8._0_8_,local_1e8 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)&local_138);
    }
    local_1b8 = (PointerType)iDynTree::MatrixDynSize::data();
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::MatrixDynSize::cols();
    local_1c0 = (VectorDynSize *)iDynTree::VectorDynSize::data();
    pdVar13 = (PointerType)iDynTree::VectorDynSize::size();
    uVar14 = iDynTree::VectorDynSize::data();
    uVar15 = iDynTree::VectorDynSize::size();
    local_218.m_storage.m_data = (double *)0x0;
    local_218.m_storage.m_rows = 0;
    local_198.m_value = lVar8;
    if (lVar7 == 0) {
LAB_0016ecf7:
      local_208 = 1.0;
      local_1a8._0_8_ = local_1b8;
      local_1f8._0_8_ = local_1c0;
      local_1f8._8_8_ = pdVar13;
      local_1a8._8_8_ = lVar7;
      Eigen::internal::gemv_dense_selector<2,1,true>::
      run<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                 local_1a8,
                 (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 local_1f8,(Matrix<double,__1,_1,_0,__1,_1> *)&local_218,&local_208);
    }
    else {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_218,lVar7,1);
      if (0 < local_218.m_storage.m_rows) {
        memset(local_218.m_storage.m_data,0,local_218.m_storage.m_rows << 3);
      }
      local_208 = 1.0;
      if (lVar7 != 1) goto LAB_0016ecf7;
      local_190 = local_1b8;
      local_188.m_value = 1;
      local_1a8._0_8_ = local_1b8;
      local_170.m_value = 0;
      vStack_168.m_value = 0;
      local_158 = local_1c0;
      local_140 = local_1c0;
      local_128.m_value = 0;
      local_180.m_value = lVar8;
      local_160 = lVar8;
      local_150.m_value = (long)pdVar13;
      local_138.m_value = (long)pdVar13;
      local_118 = pdVar13;
      if (pdVar13 == (PointerType)0x0) {
        dVar20 = 0.0;
      }
      else {
        local_1f8._8_8_ = local_1b8;
        local_1d8 = local_1c0;
        local_1e0.m_value = lVar8;
        local_1c8.m_value = (long)pdVar13;
        dVar20 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>const,1,-1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const,-1,1,true>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>const,1,_1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,_1,1,true>const>>
                           ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
                             *)local_1f8,&local_221,
                            (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
                             *)local_1a8);
      }
      *local_218.m_storage.m_data = dVar20 + *local_218.m_storage.m_data;
    }
    uVar17 = uVar15;
    if (((uVar14 & 7) == 0) &&
       (uVar17 = (ulong)((uint)(uVar14 >> 3) & 1), (long)uVar15 <= (long)uVar17)) {
      uVar17 = uVar15;
    }
    lVar7 = uVar15 - uVar17;
    if (0 < (long)uVar17) {
      uVar19 = 0;
      do {
        *(double *)(uVar14 + uVar19 * 8) = local_218.m_storage.m_data[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
    }
    uVar19 = (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
    if (1 < lVar7) {
      do {
        dVar20 = (local_218.m_storage.m_data + uVar17)[1];
        pdVar1 = (double *)(uVar14 + uVar17 * 8);
        *pdVar1 = local_218.m_storage.m_data[uVar17];
        pdVar1[1] = dVar20;
        uVar17 = uVar17 + 2;
      } while ((long)uVar17 < (long)uVar19);
    }
    if ((long)uVar19 < (long)uVar15) {
      do {
        *(double *)(uVar14 + uVar19 * 8) = local_218.m_storage.m_data[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar15 != uVar19);
    }
    free(local_218.m_storage.m_data);
    pLVar16 = this->m_pimpl;
    time = (double)local_220;
  }
  if (pLVar16->constrainsControl != true) goto LAB_0016f20a;
  local_222 = '\0';
  peVar4 = (pLVar16->controlConstraintMatrix).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_220 = (PointerType)time;
  (*peVar4->_vptr_TimeVaryingObject[2])(peVar4,&local_222);
  if (local_222 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unable to retrieve a valid control constraint matrix at time: "
               ,0x3e);
    poVar11 = std::ostream::_M_insert<double>((double)local_220);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    psVar12 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar5 = (psVar12->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar5,"evaluateConstraint",(char *)local_1f8._0_8_);
LAB_0016f0e2:
    if ((VectorDynSize *)local_1f8._0_8_ != (VectorDynSize *)&local_1e8) {
      operator_delete((void *)local_1f8._0_8_,local_1e8 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)&local_138);
    return false;
  }
  lVar7 = iDynTree::MatrixDynSize::cols();
  lVar8 = iDynTree::VectorDynSize::size();
  if (lVar7 == lVar8) {
    sVar9 = iDynTree::MatrixDynSize::rows();
    sVar10 = Constraint::constraintSize(&this->super_Constraint);
    if (sVar9 != sVar10) goto LAB_0016ee46;
  }
  else {
LAB_0016ee46:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"The control constraint matrix at time: ",0x27);
    poVar11 = std::ostream::_M_insert<double>((double)local_220);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,
               " has dimensions not matching with the specified control space dimension or constraint dimension."
               ,0x60);
    psVar12 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    pcVar5 = (psVar12->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    iDynTree::reportError(pcVar5,"evaluateConstraint",(char *)local_1f8._0_8_);
    if ((VectorDynSize *)local_1f8._0_8_ != (VectorDynSize *)&local_1e8) {
      operator_delete((void *)local_1f8._0_8_,local_1e8 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)&local_138);
  }
  local_220 = (PointerType)iDynTree::MatrixDynSize::data();
  lVar7 = iDynTree::MatrixDynSize::rows();
  lVar8 = iDynTree::MatrixDynSize::cols();
  local_200 = (VectorDynSize *)iDynTree::VectorDynSize::data();
  pdVar13 = (PointerType)iDynTree::VectorDynSize::size();
  uVar14 = iDynTree::VectorDynSize::data();
  uVar15 = iDynTree::VectorDynSize::size();
  local_218.m_storage.m_data = (double *)0x0;
  local_218.m_storage.m_rows = 0;
  if (lVar7 == 0) {
LAB_0016f134:
    local_208 = 1.0;
    local_1a8._0_8_ = local_220;
    local_1f8._0_8_ = local_200;
    local_1f8._8_8_ = pdVar13;
    local_1a8._8_8_ = lVar7;
    local_198.m_value = lVar8;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
               local_1a8,
               (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               local_1f8,(Matrix<double,__1,_1,_0,__1,_1> *)&local_218,&local_208);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_218,lVar7,1);
    if (0 < local_218.m_storage.m_rows) {
      memset(local_218.m_storage.m_data,0,local_218.m_storage.m_rows << 3);
    }
    local_208 = 1.0;
    if (lVar7 != 1) goto LAB_0016f134;
    local_190 = local_220;
    local_188.m_value = 1;
    local_1a8._0_8_ = local_220;
    local_170.m_value = 0;
    vStack_168.m_value = 0;
    local_158 = local_200;
    local_140 = local_200;
    local_128.m_value = 0;
    local_180.m_value = lVar8;
    local_160 = lVar8;
    local_150.m_value = (long)pdVar13;
    local_138.m_value = (long)pdVar13;
    local_118 = pdVar13;
    if (pdVar13 == (PointerType)0x0) {
      dVar20 = 0.0;
      local_198.m_value = lVar8;
    }
    else {
      local_1f8._8_8_ = local_220;
      local_1d8 = local_200;
      local_1e0.m_value = lVar8;
      local_1c8.m_value = (long)pdVar13;
      local_198.m_value = lVar8;
      dVar20 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>const,1,-1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const,-1,1,true>const>>,3,0>
               ::
               run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>const,1,_1,true>const>const,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,_1,1,true>const>>
                         ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>_>
                           *)local_1f8,&local_221,
                          (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_true>_>
                           *)local_1a8);
    }
    *local_218.m_storage.m_data = dVar20 + *local_218.m_storage.m_data;
  }
  uVar17 = uVar15;
  if (((uVar14 & 7) == 0) &&
     (uVar17 = (ulong)((uint)(uVar14 >> 3) & 1), (long)uVar15 <= (long)uVar17)) {
    uVar17 = uVar15;
  }
  lVar7 = uVar15 - uVar17;
  if (0 < (long)uVar17) {
    uVar19 = 0;
    do {
      *(double *)(uVar14 + uVar19 * 8) = local_218.m_storage.m_data[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar17 != uVar19);
  }
  uVar19 = (lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffeU) + uVar17;
  if (1 < lVar7) {
    do {
      dVar20 = (local_218.m_storage.m_data + uVar17)[1];
      pdVar1 = (double *)(uVar14 + uVar17 * 8);
      *pdVar1 = local_218.m_storage.m_data[uVar17];
      pdVar1[1] = dVar20;
      uVar17 = uVar17 + 2;
    } while ((long)uVar17 < (long)uVar19);
  }
  if ((long)uVar19 < (long)uVar15) {
    do {
      *(double *)(uVar14 + uVar19 * 8) = local_218.m_storage.m_data[uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar15 != uVar19);
  }
  free(local_218.m_storage.m_data);
LAB_0016f20a:
  Constraint::constraintSize(&this->super_Constraint);
  iDynTree::VectorDynSize::resize((ulong)local_1b0);
  lVar7 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  lVar8 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  uVar15 = iDynTree::VectorDynSize::data();
  uVar17 = iDynTree::VectorDynSize::size();
  uVar14 = uVar17;
  if (((uVar15 & 7) == 0) &&
     (uVar14 = (ulong)((uint)(uVar15 >> 3) & 1), (long)uVar17 <= (long)uVar14)) {
    uVar14 = uVar17;
  }
  lVar18 = uVar17 - uVar14;
  if (0 < (long)uVar14) {
    uVar19 = 0;
    do {
      *(double *)(uVar15 + uVar19 * 8) =
           *(double *)(lVar7 + uVar19 * 8) + *(double *)(lVar8 + uVar19 * 8);
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
  }
  uVar19 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
  if (1 < lVar18) {
    do {
      pdVar1 = (double *)(lVar7 + uVar14 * 8);
      dVar20 = pdVar1[1];
      pdVar2 = (double *)(lVar8 + uVar14 * 8);
      dVar6 = pdVar2[1];
      pdVar3 = (double *)(uVar15 + uVar14 * 8);
      *pdVar3 = *pdVar2 + *pdVar1;
      pdVar3[1] = dVar6 + dVar20;
      uVar14 = uVar14 + 2;
    } while ((long)uVar14 < (long)uVar19);
  }
  if ((long)uVar19 < (long)uVar17) {
    do {
      *(double *)(uVar15 + uVar19 * 8) =
           *(double *)(lVar7 + uVar19 * 8) + *(double *)(lVar8 + uVar19 * 8);
      uVar19 = uVar19 + 1;
    } while (uVar17 != uVar19);
  }
  return true;
}

Assistant:

bool LinearConstraint::evaluateConstraint(double time,
                                                  const VectorDynSize& state,
                                                  const VectorDynSize& control,
                                                  VectorDynSize& constraint)
        {
            if (m_pimpl->constrainsState) {
                bool isValid = false;
                const MatrixDynSize& stateConstraintMatrix = m_pimpl->stateConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((stateConstraintMatrix.cols() != state.size()) || (stateConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state constraint matrix at time: " << time << " has dimensions not matching with the specified state space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }
                iDynTree::iDynTreeEigenConstMatrixMap stateConstraint = iDynTree::toEigen(stateConstraintMatrix);

                iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) = stateConstraint * iDynTree::toEigen(state);
            }


            if (m_pimpl->constrainsControl) {
                bool isValid = false;
                const MatrixDynSize& controlConstraintMatrix = m_pimpl->controlConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((controlConstraintMatrix.cols() != control.size()) || (controlConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control constraint matrix at time: " << time << " has dimensions not matching with the specified control space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }

                iDynTree::iDynTreeEigenConstMatrixMap controlConstraint = iDynTree::toEigen(controlConstraintMatrix);
                iDynTree::toEigen(m_pimpl->controlConstraintsBuffer) = controlConstraint * iDynTree::toEigen(control);
            }

            constraint.resize(static_cast<unsigned int>(constraintSize()));
            toEigen(constraint) = iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) + iDynTree::toEigen(m_pimpl->controlConstraintsBuffer); //the buffers are zero if not constrained

            return true;

        }